

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLinLog *pTVar8;
  GetterYRef *pGVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  int iVar19;
  ImDrawIdx IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pIVar17 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar19 = pGVar7->Count;
  dVar2 = pGVar7->XScale;
  dVar3 = pGVar7->X0;
  dVar13 = log10((double)*(uint *)((long)pGVar7->Ys +
                                  (long)(((prim + pGVar7->Offset) % iVar19 + iVar19) % iVar19) *
                                  (long)pGVar7->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar19 = pTVar8->YAxis;
  pIVar1 = &pIVar17->CurrentPlot->YAxis[iVar19].Range;
  dVar14 = pIVar1->Min;
  pGVar9 = this->Getter2;
  pTVar8 = this->Transformer;
  IVar4 = pIVar17->PixelRange[iVar19].Min;
  fVar23 = (float)(pIVar17->My[iVar19] *
                   ((dVar14 + (double)(float)(dVar13 / pIVar17->LogDenY[iVar19]) *
                              (pIVar1->Max - dVar14)) - dVar14) + (double)IVar4.y);
  fVar24 = (float)(pIVar17->Mx *
                   ((dVar3 + (double)prim * dVar2) - (pIVar17->CurrentPlot->XAxis).Range.Min) +
                  (double)IVar4.x);
  dVar2 = pGVar9->XScale;
  dVar3 = pGVar9->X0;
  dVar14 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar19 = pTVar8->YAxis;
  pIVar10 = pIVar18->CurrentPlot;
  dVar13 = pIVar10->YAxis[iVar19].Range.Min;
  IVar4 = pIVar18->PixelRange[iVar19].Min;
  fVar21 = (float)(pIVar18->Mx * ((dVar3 + (double)prim * dVar2) - (pIVar10->XAxis).Range.Min) +
                  (double)IVar4.x);
  fVar22 = (float)(pIVar18->My[iVar19] *
                   ((dVar13 + (double)(float)(dVar14 / pIVar18->LogDenY[iVar19]) *
                              (pIVar10->YAxis[iVar19].Range.Max - dVar13)) - dVar13) +
                  (double)IVar4.y);
  auVar28._0_4_ = ~-(uint)(fVar21 <= fVar24) & (uint)fVar21;
  auVar28._4_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar28._8_4_ = ~-(uint)(fVar24 < fVar21) & (uint)fVar21;
  auVar28._12_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar15._4_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar15._0_4_ = (uint)fVar24 & -(uint)(fVar21 <= fVar24);
  auVar15._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar21);
  auVar15._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar28 = auVar28 | auVar15;
  fVar25 = (cull_rect->Min).y;
  auVar30._4_4_ = -(uint)(fVar25 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).x < auVar28._0_4_);
  auVar16._4_8_ = auVar28._8_8_;
  auVar16._0_4_ = -(uint)(auVar28._4_4_ < fVar25);
  auVar29._0_8_ = auVar16._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).x);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).y);
  auVar30._8_8_ = auVar29._8_8_;
  iVar19 = movmskps((int)pIVar10,auVar30);
  if (iVar19 == 0xf) {
    IVar5 = this->Col;
    IVar4 = *uv;
    fVar25 = fVar21 - fVar24;
    fVar26 = fVar22 - fVar23;
    fVar27 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar25 = fVar25 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar25 = fVar27 * fVar25;
    fVar27 = fVar27 * fVar26;
    (pIVar11->pos).x = fVar27 + fVar24;
    (pIVar11->pos).y = fVar23 - fVar25;
    (pIVar11->uv).x = IVar4.x;
    (pIVar11->uv).y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar5;
    pIVar11[1].pos.x = fVar27 + fVar21;
    pIVar11[1].pos.y = fVar22 - fVar25;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar5;
    pIVar11[2].pos.x = fVar21 - fVar27;
    pIVar11[2].pos.y = fVar22 + fVar25;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar5;
    pIVar11[3].pos.x = fVar24 - fVar27;
    pIVar11[3].pos.y = fVar25 + fVar23;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar6;
    *pIVar12 = IVar20;
    pIVar12[1] = IVar20 + 1;
    pIVar12[2] = IVar20 + 2;
    pIVar12[3] = IVar20;
    pIVar12[4] = IVar20 + 2;
    pIVar12[5] = IVar20 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  return (char)iVar19 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }